

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_attribute.cc
# Opt level: O2

bool __thiscall draco::GeometryAttribute::operator==(GeometryAttribute *this,GeometryAttribute *va)

{
  int iVar1;
  
  iVar1 = memcmp(&this->byte_stride_,&va->byte_stride_,0x14);
  if ((iVar1 == 0) &&
     (iVar1 = memcmp(&this->buffer_descriptor_,&va->buffer_descriptor_,0x11), iVar1 == 0)) {
    return this->data_type_ == va->data_type_;
  }
  return false;
}

Assistant:

bool GeometryAttribute::operator==(const GeometryAttribute &va) const {
  if (attribute_type_ != va.attribute_type_) {
    return false;
  }
  // It's OK to compare just the buffer descriptors here. We don't need to
  // compare the buffers themselves.
  if (buffer_descriptor_.buffer_id != va.buffer_descriptor_.buffer_id) {
    return false;
  }
  if (buffer_descriptor_.buffer_update_count !=
      va.buffer_descriptor_.buffer_update_count) {
    return false;
  }
  if (num_components_ != va.num_components_) {
    return false;
  }
  if (data_type_ != va.data_type_) {
    return false;
  }
  if (byte_stride_ != va.byte_stride_) {
    return false;
  }
  if (byte_offset_ != va.byte_offset_) {
    return false;
  }
  return true;
}